

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boosting.cc
# Opt level: O0

void save_load(boosting *o,io_buf *model_file,bool read,bool text)

{
  size_t sVar1;
  ostream *poVar2;
  void *pvVar3;
  reference pvVar4;
  byte in_CL;
  byte in_DL;
  long in_RSI;
  int *in_RDI;
  double dVar5;
  int i_1;
  stringstream os2;
  float f;
  int i;
  stringstream os;
  undefined8 in_stack_fffffffffffffc58;
  stringstream *in_stack_fffffffffffffc60;
  size_type in_stack_fffffffffffffc68;
  vector<float,_std::allocator<float>_> *in_stack_fffffffffffffc70;
  size_t in_stack_fffffffffffffc78;
  char *in_stack_fffffffffffffc80;
  io_buf *in_stack_fffffffffffffc88;
  int local_344;
  stringstream local_340 [16];
  stringstream local_330 [47];
  undefined1 in_stack_fffffffffffffcff;
  stringstream *in_stack_fffffffffffffd00;
  size_t in_stack_fffffffffffffd08;
  char *in_stack_fffffffffffffd10;
  io_buf *in_stack_fffffffffffffd18;
  char *in_stack_fffffffffffffe20;
  size_t in_stack_fffffffffffffe28;
  char *in_stack_fffffffffffffe30;
  io_buf *in_stack_fffffffffffffe38;
  value_type local_1b4;
  int local_1b0;
  stringstream local_1a0 [16];
  ostream local_190;
  byte local_12;
  byte local_11;
  int *local_8;
  
  local_11 = in_DL & 1;
  local_12 = in_CL & 1;
  local_8 = in_RDI;
  sVar1 = v_array<int>::size((v_array<int> *)(in_RSI + 0x30));
  if (sVar1 != 0) {
    std::__cxx11::stringstream::stringstream(local_1a0);
    poVar2 = std::operator<<(&local_190,"boosts ");
    pvVar3 = (void *)std::ostream::operator<<(poVar2,*local_8);
    std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
    bin_text_read_write_fixed
              (in_stack_fffffffffffffc88,in_stack_fffffffffffffc80,in_stack_fffffffffffffc78,
               (char *)in_stack_fffffffffffffc70,SUB81(in_stack_fffffffffffffc68 >> 0x38,0),
               in_stack_fffffffffffffc60,SUB81((ulong)in_stack_fffffffffffffc58 >> 0x38,0));
    if ((local_11 & 1) != 0) {
      std::vector<float,_std::allocator<float>_>::resize
                (in_stack_fffffffffffffc70,in_stack_fffffffffffffc68);
    }
    for (local_1b0 = 0; local_1b0 < *local_8; local_1b0 = local_1b0 + 1) {
      if ((local_11 & 1) == 0) {
        std::__cxx11::stringstream::stringstream(local_340);
        poVar2 = std::operator<<((ostream *)(local_340 + 0x10),"alpha ");
        pvVar4 = std::vector<float,_std::allocator<float>_>::operator[]
                           ((vector<float,_std::allocator<float>_> *)(local_8 + 0x12),
                            (long)local_1b0);
        pvVar3 = (void *)std::ostream::operator<<(poVar2,*pvVar4);
        std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
        std::vector<float,_std::allocator<float>_>::operator[]
                  ((vector<float,_std::allocator<float>_> *)(local_8 + 0x12),(long)local_1b0);
        bin_text_write_fixed
                  (in_stack_fffffffffffffd18,in_stack_fffffffffffffd10,in_stack_fffffffffffffd08,
                   in_stack_fffffffffffffd00,(bool)in_stack_fffffffffffffcff);
        std::__cxx11::stringstream::~stringstream(local_340);
      }
      else {
        io_buf::bin_read_fixed
                  (in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,
                   in_stack_fffffffffffffe20);
        pvVar4 = std::vector<float,_std::allocator<float>_>::operator[]
                           ((vector<float,_std::allocator<float>_> *)(local_8 + 0x12),
                            (long)local_1b0);
        *pvVar4 = local_1b4;
      }
    }
    if ((*(byte *)(*(long *)(local_8 + 10) + 0x3439) & 1) == 0) {
      if ((local_11 & 1) == 0) {
        poVar2 = std::operator<<((ostream *)&std::cerr,"Saving alpha, current weighted_examples = ")
        ;
        dVar5 = shared_data::weighted_examples((shared_data *)**(undefined8 **)(local_8 + 10));
        pvVar3 = (void *)std::ostream::operator<<(poVar2,dVar5);
        std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
      }
      else {
        poVar2 = std::operator<<((ostream *)&std::cerr,"Loading alpha: ");
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      }
      for (local_344 = 0; local_344 < *local_8; local_344 = local_344 + 1) {
        pvVar4 = std::vector<float,_std::allocator<float>_>::operator[]
                           ((vector<float,_std::allocator<float>_> *)(local_8 + 0x12),
                            (long)local_344);
        poVar2 = (ostream *)std::ostream::operator<<(&std::cerr,*pvVar4);
        poVar2 = std::operator<<(poVar2," ");
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      }
      std::ostream::operator<<(&std::cerr,std::endl<char,std::char_traits<char>>);
    }
    std::__cxx11::stringstream::~stringstream(local_1a0);
  }
  return;
}

Assistant:

void save_load(boosting& o, io_buf& model_file, bool read, bool text)
{
  if (model_file.files.size() == 0)
    return;
  stringstream os;
  os << "boosts " << o.N << endl;
  bin_text_read_write_fixed(model_file, (char*)&(o.N), sizeof(o.N), "", read, os, text);

  if (read)
    o.alpha.resize(o.N);

  for (int i = 0; i < o.N; i++)
    if (read)
    {
      float f;
      model_file.bin_read_fixed((char*)&f, sizeof(f), "");
      o.alpha[i] = f;
    }
    else
    {
      stringstream os2;
      os2 << "alpha " << o.alpha[i] << endl;
      bin_text_write_fixed(model_file, (char*)&(o.alpha[i]), sizeof(o.alpha[i]), os2, text);
    }

  if (!o.all->quiet)
  {
    if (read)
      cerr << "Loading alpha: " << endl;
    else
      cerr << "Saving alpha, current weighted_examples = " << o.all->sd->weighted_examples() << endl;
    for (int i = 0; i < o.N; i++) cerr << o.alpha[i] << " " << endl;

    cerr << endl;
  }
}